

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::TryToChangeDirectory(cmCTest *this,string *dir)

{
  _func_int **pp_Var1;
  ostream *poVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  Kind KVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  Status status;
  ostringstream cmCTestLog_msg;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  string local_1e8;
  Status local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [16];
  _func_int *local_190 [12];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Internal ctest changing into directory: ",0x28);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(dir->_M_dataplus)._M_p,dir->_M_string_length);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,1,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x653,(char *)local_208,false);
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  local_1c8 = cmsys::SystemTools::ChangeDirectory(dir);
  KVar9 = local_1c8.Kind_;
  if (KVar9 == Success) goto LAB_00169fc7;
  std::operator+(&local_1c0,"Failed to change working directory to \"",dir);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_218 = *puVar5;
    lStack_210 = plVar3[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *puVar5;
    local_228 = (ulong *)*plVar3;
  }
  local_220 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  cmsys::Status::GetString_abi_cxx11_(&local_1e8,&local_1c8);
  uVar7 = 0xf;
  if (local_228 != &local_218) {
    uVar7 = local_218;
  }
  if (uVar7 < local_1e8._M_string_length + local_220) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar8 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_1e8._M_string_length + local_220) goto LAB_00169df6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_228);
  }
  else {
LAB_00169df6:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_1a0._0_8_ = local_190;
  pp_Var1 = (_func_int **)(puVar4 + 2);
  if ((_func_int **)*puVar4 == pp_Var1) {
    local_190[0] = *pp_Var1;
    local_190[1] = (_func_int *)puVar4[3];
  }
  else {
    local_190[0] = *pp_Var1;
    local_1a0._0_8_ = (_func_int **)*puVar4;
  }
  local_1a0._8_8_ = puVar4[1];
  *puVar4 = pp_Var1;
  puVar4[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_1a0);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_1f8 = *plVar6;
    lStack_1f0 = plVar3[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar6;
    local_208 = (long *)*plVar3;
  }
  local_200 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((_func_int **)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_,(ulong)(local_190[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(char *)local_208,local_200);
  std::__cxx11::stringbuf::str();
  Log(this,7,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x658,(char *)local_228,false);
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
LAB_00169fc7:
  return KVar9 == Success;
}

Assistant:

bool cmCTest::TryToChangeDirectory(std::string const& dir)
{
  cmCTestLog(this, OUTPUT,
             "Internal ctest changing into directory: " << dir << std::endl);
  cmsys::Status status = cmSystemTools::ChangeDirectory(dir);
  if (!status) {
    auto msg = "Failed to change working directory to \"" + dir +
      "\" : " + status.GetString() + "\n";
    cmCTestLog(this, ERROR_MESSAGE, msg);
    return false;
  }
  return true;
}